

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergepatch.hpp
# Opt level: O2

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> __thiscall
jsoncons::mergepatch::
from_diff<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
          (mergepatch *this,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *source
          ,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *target)

{
  bool bVar1;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this_00;
  bool bVar2;
  byte bVar3;
  type_conflict9 tVar4;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *args;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar5;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *member;
  __normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  _Var6;
  value_type *rhs;
  const_object_iterator cVar7;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> bVar8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *result;
  string_view_type local_b0;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_a0;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_98;
  const_object_range_type local_90;
  undefined1 local_70 [16];
  __normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  local_60;
  bool local_58;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *local_50;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *local_48;
  mergepatch local_40 [16];
  
  bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object(source);
  if ((bVar2) &&
     (bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object(target),
     bVar2)) {
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,&local_90);
    local_48 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)source;
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
              (&local_90,(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)source);
    bVar2 = local_90.last_.has_value_;
    local_98 = local_90.last_.it_._M_current;
    local_a0 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *)CONCAT71(local_a0._1_7_,local_90.first_.has_value_);
    bVar3 = local_90.first_.has_value_ & local_90.last_.has_value_;
    _Var6._M_current = local_90.first_.it_._M_current;
    local_50 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)target;
    while( true ) {
      bVar1 = (bool)(byte)local_a0 == bVar2;
      if ((bVar3 & 1) != 0) {
        bVar1 = _Var6._M_current == local_98;
      }
      if (bVar1) break;
      local_70._8_8_ = ((_Var6._M_current)->key_)._M_dataplus._M_p;
      local_70._0_8_ = ((_Var6._M_current)->key_)._M_string_length;
      cVar7 = basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::find_abi_cxx11_
                        ((basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)target,
                         (string_view_type *)local_70);
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
                ((const_object_range_type *)local_70,
                 (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)target);
      if ((((undefined1  [16])cVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
         ((local_58 & 1U) == 0)) {
        if (cVar7.has_value_ != local_58) goto LAB_002eaf91;
LAB_002eaff9:
        local_b0._M_str = ((_Var6._M_current)->key_)._M_dataplus._M_p;
        local_b0._M_len = ((_Var6._M_current)->key_)._M_string_length;
        args = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
        try_emplace<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
                  ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                    *)local_70,(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)this
                   ,&local_b0,args);
      }
      else {
        if (cVar7.it_._M_current._M_current == local_60._M_current) goto LAB_002eaff9;
LAB_002eaf91:
        rhs = &(cVar7.it_._M_current._M_current)->value_;
        tVar4 = jsoncons::operator!=(&(_Var6._M_current)->value_,rhs);
        if (tVar4) {
          local_b0._M_str = ((_Var6._M_current)->key_)._M_dataplus._M_p;
          local_b0._M_len = ((_Var6._M_current)->key_)._M_string_length;
          from_diff<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                    (local_40,&(_Var6._M_current)->value_,rhs);
          basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
          try_emplace<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                    ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                      *)local_70,
                     (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)this,&local_b0
                     ,(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_40);
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_40);
          target = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_50;
        }
      }
      _Var6._M_current = _Var6._M_current + 1;
    }
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
              (&local_90,(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)target);
    this_00 = local_48;
    local_a0 = local_90.last_.it_._M_current;
    local_98 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *)CONCAT71(local_98._1_7_,local_90.first_.has_value_);
    uVar5 = extraout_RDX_00;
    _Var6._M_current = local_90.first_.it_._M_current;
    while( true ) {
      bVar2 = (bool)(byte)local_98 == local_90.last_.has_value_;
      if ((local_90.first_.has_value_ & local_90.last_.has_value_ & 1U) != 0) {
        bVar2 = _Var6._M_current == local_a0;
      }
      if (bVar2) break;
      local_70._8_8_ = ((_Var6._M_current)->key_)._M_dataplus._M_p;
      local_70._0_8_ = ((_Var6._M_current)->key_)._M_string_length;
      cVar7 = basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::find_abi_cxx11_
                        (this_00,(string_view_type *)local_70);
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
                ((const_object_range_type *)local_70,this_00);
      uVar5 = extraout_RDX_01;
      if ((((undefined1  [16])cVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
         ((local_58 & 1U) == 0)) {
        if (cVar7.has_value_ == local_58) goto LAB_002eb0ed;
      }
      else if (cVar7.it_._M_current._M_current == local_60._M_current) {
LAB_002eb0ed:
        local_b0._M_str = ((_Var6._M_current)->key_)._M_dataplus._M_p;
        local_b0._M_len = ((_Var6._M_current)->key_)._M_string_length;
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
        try_emplace<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
                  ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                    *)local_70,(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)this
                   ,&local_b0,&(_Var6._M_current)->value_);
        uVar5 = extraout_RDX_02;
      }
      _Var6._M_current = _Var6._M_current + 1;
    }
  }
  else {
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,target);
    uVar5 = extraout_RDX;
  }
  bVar8.field_0.int64_.val_ = uVar5;
  bVar8.field_0._0_8_ = this;
  return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar8.field_0;
}

Assistant:

Json from_diff(const Json& source, const Json& target)
    {
        if (!source.is_object() || !target.is_object())
        {
            return target;
        }
        Json result(json_object_arg);

        for (const auto& member : source.object_range())
        {
            auto it = target.find(member.key());
            if (it != target.object_range().end())
            {
                if (member.value() != (*it).value())
                {
                    result.try_emplace(member.key(), from_diff(member.value(), (*it).value()));
                }
            }
            else
            {
                result.try_emplace(member.key(), Json::null());
            }
        }

        for (const auto& member : target.object_range())
        {
            auto it = source.find(member.key());
            if (it == source.object_range().end())
            {
                result.try_emplace(member.key(), member.value());
            }
        }

        return result;
    }